

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.hpp
# Opt level: O2

bool helics::
     addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
               (value *section,string *targetName,anon_class_8_1_36d583d8 callback)

{
  pointer pbVar1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  array_type *paVar2;
  string_type *psVar3;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  __str;
  bool bVar4;
  basic_value<toml::type_config> *target;
  pointer this;
  string target_1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  value uval;
  anon_class_8_1_36d583d8 local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_value<toml::type_config> local_1c0;
  basic_value<toml::type_config> local_f8;
  
  local_1e8.translator = callback.translator;
  toml::basic_value<toml::type_config>::basic_value(&local_f8);
  v = toml::find_or<toml::type_config,std::__cxx11::string>(section,targetName,&local_f8);
  toml::basic_value<toml::type_config>::basic_value(&local_1c0,v);
  if (local_1c0.type_ == empty) {
    bVar4 = false;
  }
  else if (local_1c0.type_ == array) {
    paVar2 = toml::basic_value<toml::type_config>::as_array(&local_1c0);
    pbVar1 = (paVar2->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (this = (paVar2->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_start; this != pbVar1; this = this + 1) {
      psVar3 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(this);
      Federate::registerConnectorInterfacesToml::anon_class_8_1_36d583d8::operator()
                (&local_1e8,psVar3);
    }
    bVar4 = true;
  }
  else {
    psVar3 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(&local_1c0);
    bVar4 = true;
    Federate::registerConnectorInterfacesToml::anon_class_8_1_36d583d8::operator()
              (&local_1e8,psVar3);
  }
  if ((targetName->_M_dataplus)._M_p[targetName->_M_string_length - 1] == 's') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (targetName);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_local_buf[0] = '\0';
    __str = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                      (section,targetName,&local_1e0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_1e0,__str);
    if (local_1e0._M_string_length != 0) {
      bVar4 = true;
      Federate::registerConnectorInterfacesToml::anon_class_8_1_36d583d8::operator()
                (&local_1e8,&local_1e0);
    }
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  toml::basic_value<toml::type_config>::~basic_value(&local_1c0);
  toml::basic_value<toml::type_config>::~basic_value(&local_f8);
  return bVar4;
}

Assistant:

bool addTargets(const toml::value& section, std::string targetName, Callable callback)
{
    bool found{false};
    toml::value uval;
    // There should probably be a static_assert here but there isn't a nice type trait to check that
    auto targets = toml::find_or(section, targetName, uval);
    if (!targets.is_empty()) {
        if (targets.is_array()) {
            auto& targetArray = targets.as_array();
            for (const auto& target : targetArray) {
                callback(static_cast<const std::string&>(target.as_string()));
            }
        } else {
            callback(static_cast<const std::string&>(targets.as_string()));
        }
        found = true;
    }
    if (targetName.back() == 's') {
        targetName.pop_back();
        std::string target;
        target = toml::find_or(section, targetName, target);
        if (!target.empty()) {
            found = true;
            callback(target);
        }
    }
    return found;
}